

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall chatra::RuntimeImp::stop(RuntimeImp *this,InstanceId instanceId)

{
  SpinLock *pSVar1;
  __atomic_flag_data_type _Var2;
  Instance *pIVar3;
  Package *pPVar4;
  undefined8 *puVar5;
  InstanceId local_20;
  InstanceId instanceId_local;
  
  local_20 = instanceId;
  pIVar3 = IdPool<chatra::InstanceId,_chatra::Instance>::lockAndRef(&this->instanceIds,instanceId);
  if ((pIVar3 == (Instance *)0x0) || (pIVar3->primaryPackageId == 0xffffffffffffffff)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar5 = 0;
    puVar5[1] = 0;
    puVar5[2] = 0;
    puVar5[3] = 0;
    puVar5[4] = 0;
    puVar5[1] = puVar5 + 3;
    puVar5[2] = 0;
    *(undefined1 *)(puVar5 + 3) = 0;
    *puVar5 = &PTR__NativeException_00245b18;
    __cxa_throw(puVar5,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
  }
  do {
    LOCK();
    _Var2 = (pIVar3->lockThreads).flag.super___atomic_flag_base._M_i;
    (pIVar3->lockThreads).flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  if ((pIVar3->threads)._M_h._M_element_count == 0) {
    (pIVar3->lockThreads).flag.super___atomic_flag_base._M_i = false;
    pPVar4 = IdPool<chatra::PackageId,_chatra::Package>::lockAndRef
                       (&this->packageIds,pIVar3->primaryPackageId);
    pSVar1 = &pPVar4->lockInstances;
    do {
      LOCK();
      _Var2 = (pSVar1->flag).super___atomic_flag_base._M_i;
      (pSVar1->flag).super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var2 != false);
    std::
    _Hashtable<chatra::InstanceId,_std::pair<const_chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>_>,_std::allocator<std::pair<const_chatra::InstanceId,_std::unique_ptr<chatra::Instance,_std::default_delete<chatra::Instance>_>_>_>,_std::__detail::_Select1st,_std::equal_to<chatra::InstanceId>,_std::hash<chatra::InstanceId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(pPVar4->instances)._M_h,&local_20);
    (pSVar1->flag).super___atomic_flag_base._M_i = false;
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  puVar5[4] = 0;
  puVar5[1] = puVar5 + 3;
  puVar5[2] = 0;
  *(undefined1 *)(puVar5 + 3) = 0;
  *puVar5 = &PTR__NativeException_00246918;
  __cxa_throw(puVar5,&UnsupportedOperationException::typeinfo,NativeException::~NativeException);
}

Assistant:

void RuntimeImp::stop(InstanceId instanceId) {
	auto* instance = instanceIds.lockAndRef(instanceId);
	if (instance == nullptr)
		throw IllegalArgumentException();

	auto primaryPackageId = instance->primaryPackageId;
	if (primaryPackageId == enum_max<PackageId>::value)
		throw IllegalArgumentException();

	{
		std::lock_guard<SpinLock> lock0(instance->lockThreads);
		if (!instance->threads.empty())
			throw UnsupportedOperationException();
	}

	auto* package = packageIds.lockAndRef(instance->primaryPackageId);
	chatra_assert(package != nullptr);
	{
		std::lock_guard<SpinLock> lock1(package->lockInstances);
		package->instances.erase(instanceId);
	}
}